

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

config_value * config_value_duplicate(config_value *value)

{
  config_array *pcVar1;
  anon_union_8_4_a3489a58_for_data aVar2;
  undefined4 uVar3;
  config_value *__ptr;
  config_value *pcVar4;
  config_array *array;
  int iVar5;
  ulong uVar6;
  
  __ptr = (config_value *)malloc(0x10);
  if (__ptr == (config_value *)0x0) {
    return (config_value *)0x0;
  }
  uVar3 = *(undefined4 *)&value->field_0x4;
  aVar2 = value->data;
  __ptr->type = value->type;
  *(undefined4 *)&__ptr->field_0x4 = uVar3;
  __ptr->data = aVar2;
  switch(value->type) {
  case ARRAY:
    pcVar1 = (value->data).array;
    array = config_array_create(pcVar1->length);
    if (array == (config_array *)0x0) {
LAB_00107ab0:
      array = (config_array *)0x0;
    }
    else if (array->length != 0) {
      uVar6 = 0;
      do {
        pcVar4 = config_value_duplicate(pcVar1->values[uVar6]);
        if (pcVar4 == (config_value *)0x0) {
          iVar5 = 5;
          goto LAB_00107aa3;
        }
        array->values[uVar6] = pcVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 < array->length);
      iVar5 = 2;
LAB_00107aa3:
      if (iVar5 == 5) {
        config_array_destroy(array);
        goto LAB_00107ab0;
      }
    }
    (__ptr->data).array = array;
    break;
  case BOOLEAN:
    (__ptr->data).boolean = (value->data).boolean;
    return __ptr;
  case NUMBER:
    __ptr->data = value->data;
    return __ptr;
  case STRING:
    array = (config_array *)string_init((value->data).string);
    (__ptr->data).string = (char *)array;
    break;
  default:
    goto switchD_00107a4f_default;
  }
  if (array != (config_array *)0x0) {
    return __ptr;
  }
switchD_00107a4f_default:
  free(__ptr);
  return (config_value *)0x0;
}

Assistant:

struct config_value *config_value_duplicate(const struct config_value *value)
{
        struct config_value *new_value = malloc(sizeof(struct config_value));

        if (new_value == NULL) {
                return NULL;
        }

        memcpy(new_value, value, sizeof(struct config_value));

        switch (value->type) {
        case ARRAY:
                new_value->data.array = config_array_duplicate(value->data.array);

                if (new_value->data.array == NULL) {
                        goto free_and_error;
                }

                break;
        case BOOLEAN:
                new_value->data.boolean = value->data.boolean;

                break;
        case STRING:
                new_value->data.string = string_init(value->data.string);

                if (new_value->data.string == NULL) {
                        goto free_and_error;
                }

                break;
        case NUMBER:
                new_value->data.number = value->data.number;

                break;
        default:
                goto free_and_error;
        }

        return new_value;

free_and_error:
        free(new_value);

        return NULL;
}